

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.hpp
# Opt level: O0

void __thiscall gamespace::Match::Match(Match *this,Match *other)

{
  Match **ppMVar1;
  Match *other_local;
  Match *this_local;
  
  GameBoard::GameBoard(&this->_board,&other->_board);
  std::
  vector<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ::vector(&this->_move,&other->_move);
  std::vector<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>::vector
            (&this->_on_player_change,&other->_on_player_change);
  std::
  vector<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ::vector(&this->_on_win,&other->_on_win);
  std::
  vector<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ::vector(&this->_on_move,&other->_on_move);
  Player::Player(&this->_player1,&other->_player1);
  Player::Player(&this->_player2,&other->_player2);
  this->_currentPlayer = &this->_player1;
  this->_turn = 0;
  this->_lid = other->_lid;
  other->_currentPlayer = (Player *)0x0;
  ppMVar1 = GameBoard::match(&this->_board);
  *ppMVar1 = this;
  return;
}

Assistant:

Match(Match &&other)
        : _board(std::move(other._board)), _move(std::move(other._move))
        , _on_player_change(std::move(other._on_player_change)), _on_win(std::move(other._on_win))
        , _on_move(std::move(other._on_move))
        , _player1(std::move(other._player1))
        , _player2(std::move(other._player2))
        , _currentPlayer(&_player1), _turn(0), _lid(other._lid) {
            other._currentPlayer = nullptr;
            _board.match() = this;
        }